

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpu_helper.c
# Opt level: O0

void helper_fprem_x86_64(CPUX86State *env)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  floatx80 fVar8;
  floatx80 a;
  double local_a8;
  double local_a0;
  undefined6 uStack_86;
  int N;
  undefined6 uStack_6e;
  ulong local_68;
  longlong q;
  int expdif;
  CPU_LDoubleU fptemp1;
  CPU_LDoubleU fpsrcop1;
  double fptemp;
  double fpsrcop;
  double dblq;
  double st1;
  double st0;
  CPUX86State *env_local;
  
  fVar8._10_6_ = 0;
  fVar8._0_10_ = *(unkuint10 *)(env->fpregs + env->fpstt);
  dVar4 = floatx80_to_double(env,fVar8);
  a._10_6_ = 0;
  a._0_10_ = *(unkuint10 *)(env->fpregs + (env->fpstt + 1 & 7));
  dVar5 = floatx80_to_double(env,a);
  iVar3 = 1;
  if ((long)dVar4 < 0) {
    iVar3 = -1;
  }
  iVar2 = 0;
  if (ABS(dVar4) == INFINITY) {
    iVar2 = iVar3;
  }
  if ((((iVar2 != 0) || (NAN(dVar4))) || (NAN(dVar5))) || ((dVar5 == 0.0 && (!NAN(dVar5))))) {
    uVar1 = env->fpstt;
    fVar8 = double_to_floatx80(env,NAN);
    env->fpregs[uVar1].d.low = fVar8.low;
    *(ulong *)((long)(env->fpregs + uVar1) + 8) = CONCAT62(uStack_6e,fVar8.high);
    env->fpus = env->fpus & 0xb8ff;
  }
  else {
    fpsrcop1.d.low._0_2_ =
         (undefined2)*(undefined8 *)((long)env->fpregs + (ulong)env->fpstt * 0x10 + 8);
    fptemp1.d.low._0_2_ =
         (undefined2)*(undefined8 *)((long)env->fpregs + (ulong)(env->fpstt + 1 & 7) * 0x10 + 8);
    iVar3 = ((ushort)fpsrcop1.d.low._0_2_ & 0x7fff) - ((ushort)fptemp1.d.low._0_2_ & 0x7fff);
    if (iVar3 < 0) {
      env->fpus = env->fpus & 0xb8ff;
    }
    else {
      if (iVar3 < 0x35) {
        dVar6 = dVar4 / dVar5;
        if (0.0 <= dVar6) {
          local_a0 = floor(dVar6);
        }
        else {
          local_a0 = ceil(dVar6);
        }
        dVar7 = -dVar5 * local_a0;
        if (local_a0 < 0.0) {
          local_a0 = -local_a0;
        }
        local_68 = (ulong)local_a0;
        env->fpus = env->fpus & 0xb8ff;
        env->fpus = env->fpus | (ushort)((local_68 & 4) << 6);
        env->fpus = env->fpus | (ushort)((local_68 & 2) << 0xd);
        env->fpus = env->fpus | (ushort)((local_68 & 1) << 9);
      }
      else {
        env->fpus = env->fpus | 0x400;
        dVar7 = pow(2.0,(double)(iVar3 - (iVar3 % 0x20 + 0x20)));
        dVar6 = (dVar4 / dVar5) / dVar7;
        if (0.0 <= dVar6) {
          local_a8 = floor(dVar6);
        }
        else {
          local_a8 = floor(ABS(dVar6));
          local_a8 = -local_a8;
        }
        dVar7 = -(dVar5 * local_a8) * dVar7;
      }
      st1 = dVar7 + dVar4;
      uVar1 = env->fpstt;
      fVar8 = double_to_floatx80(env,st1);
      env->fpregs[uVar1].d.low = fVar8.low;
      *(ulong *)((long)(env->fpregs + uVar1) + 8) = CONCAT62(uStack_86,fVar8.high);
    }
  }
  return;
}

Assistant:

void helper_fprem(CPUX86State *env)
{
    double st0, st1, dblq, fpsrcop, fptemp;
    CPU_LDoubleU fpsrcop1, fptemp1;
    int expdif;
    signed long long int q;

    st0 = floatx80_to_double(env, ST0);
    st1 = floatx80_to_double(env, ST1);

    if (isinf(st0) || isnan(st0) || isnan(st1) || (st1 == 0.0)) {
        ST0 = double_to_floatx80(env, NAN); /* NaN */
        env->fpus &= ~0x4700; /* (C3,C2,C1,C0) <-- 0000 */
        return;
    }

    fpsrcop = st0;
    fptemp = st1;
    fpsrcop1.d = ST0;
    fptemp1.d = ST1;
    expdif = EXPD(fpsrcop1) - EXPD(fptemp1);

    if (expdif < 0) {
        /* optimisation? taken from the AMD docs */
        env->fpus &= ~0x4700; /* (C3,C2,C1,C0) <-- 0000 */
        /* ST0 is unchanged */
        return;
    }

    if (expdif < 53) {
        dblq = fpsrcop / fptemp; /* ST0 / ST1 */
        /* round dblq towards zero */
        dblq = (dblq < 0.0) ? ceil(dblq) : floor(dblq);
        st0 = fpsrcop - fptemp * dblq; /* fpsrcop is ST0 */

        /* convert dblq to q by truncating towards zero */
        if (dblq < 0.0) {
            q = (signed long long int)(-dblq);
        } else {
            q = (signed long long int)dblq;
        }

        env->fpus &= ~0x4700; /* (C3,C2,C1,C0) <-- 0000 */
        /* (C0,C3,C1) <-- (q2,q1,q0) */
        env->fpus |= (q & 0x4) << (8 - 2);  /* (C0) <-- q2 */
        env->fpus |= (q & 0x2) << (14 - 1); /* (C3) <-- q1 */
        env->fpus |= (q & 0x1) << (9 - 0);  /* (C1) <-- q0 */
    } else {
        int N = 32 + (expdif % 32); /* as per AMD docs */

        env->fpus |= 0x400;  /* C2 <-- 1 */
        fptemp = pow(2.0, (double)(expdif - N));
        fpsrcop = (st0 / st1) / fptemp;
        /* fpsrcop = integer obtained by chopping */
        fpsrcop = (fpsrcop < 0.0) ?
                  -(floor(fabs(fpsrcop))) : floor(fpsrcop);
        st0 -= (st1 * fpsrcop * fptemp);
    }
    ST0 = double_to_floatx80(env, st0);
}